

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O0

void __thiscall
SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>
::SharedMutexTest_TryLockFail_Test
          (SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>
           *this)

{
  SharedMutexTest_TryLockFail_Test<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>
  *this_local;
  
  SharedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>::
  SharedMutexTest(&this->
                   super_SharedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>
                 );
  (this->super_SharedMutexTest<yamc::fair::basic_shared_timed_mutex<yamc::rwlock::TaskFairness>_>).
  super_Test._vptr_Test = (_func_int **)&PTR__SharedMutexTest_TryLockFail_Test_00449ba0;
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, TryLockFail)
{
  yamc::test::barrier step(2);
  TypeParam mtx;
  // reader-thread
  yamc::test::join_thread thd([&]{
    ASSERT_NO_THROW(mtx.lock_shared());
    step.await();  // b1
    step.await();  // b2
    ASSERT_NO_THROW(mtx.unlock_shared());
  });
  // writer-thread
  {
    step.await();  // b1
    EXPECT_FALSE(mtx.try_lock());
    step.await();  // b2
  }
}